

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void tcg_reg_alloc_call(TCGContext_conflict9 *s,TCGOp *op)

{
  TCGReg TVar1;
  uint uVar2;
  tcg_insn_unit *dest;
  ulong uVar3;
  _Bool _Var4;
  ushort uVar5;
  uint uVar6;
  TCGReg TVar7;
  TCGTemp *pTVar8;
  byte bVar9;
  uint local_68;
  TCGRegSet arg_set;
  TCGRegSet allocated_regs;
  int allocate_args;
  tcg_insn_unit *func_addr;
  size_t call_stack_size;
  intptr_t stack_offset;
  TCGTemp *ts;
  TCGArg arg;
  TCGReg local_30;
  TCGReg reg;
  int i;
  int nb_regs;
  int flags;
  TCGLifeData arg_life;
  int nb_iargs;
  int nb_oargs;
  TCGOp *op_local;
  TCGContext_conflict9 *s_local;
  
  uVar6 = *(uint *)op >> 0xc & 0xf;
  TVar7 = *(uint *)op >> 8 & TCG_REG_R15;
  uVar5 = (ushort)((uint)*(undefined4 *)op >> 0x10);
  dest = (tcg_insn_unit *)op->args[(int)(uVar6 + TVar7)];
  uVar3 = op->args[(int)(uVar6 + TVar7 + 1)];
  reg = TCG_REG_ESI;
  if (TVar7 < TCG_REG_ESI) {
    reg = TVar7;
  }
  if (((long)(int)(TVar7 - reg) * 8 + 0xfU & 0xfffffffffffffff0) < 0x81) {
    call_stack_size = 0;
    for (local_30 = reg; (int)local_30 < (int)TVar7; local_30 = local_30 + TCG_REG_ECX) {
      if (op->args[(int)(uVar6 + local_30)] != 0) {
        pTVar8 = arg_temp(op->args[(int)(uVar6 + local_30)]);
        temp_load(s,pTVar8,s->tcg_target_available_regs
                           [(uint)((ulong)*(undefined8 *)pTVar8 >> 0x18) & 0xff],s->reserved_regs,0)
        ;
        tcg_out_st(s,(TCGType_conflict)((ulong)*(undefined8 *)pTVar8 >> 0x18) & 0xff,
                   (TCGReg)*(undefined8 *)pTVar8 & 0xff,TCG_REG_CALL_STACK,call_stack_size);
      }
      call_stack_size = call_stack_size + 8;
    }
    local_68 = s->reserved_regs;
    for (local_30 = 0; TVar1 = uVar6, (int)local_30 < (int)reg; local_30 = local_30 + 1) {
      if (op->args[(int)(uVar6 + local_30)] != 0) {
        pTVar8 = arg_temp(op->args[(int)(uVar6 + local_30)]);
        TVar1 = tcg_target_call_iarg_regs[(int)local_30];
        if (((uint)((ulong)*(undefined8 *)pTVar8 >> 8) & 0xff) == 1) {
          if (((TCGReg)*(undefined8 *)pTVar8 & 0xff) != TVar1) {
            tcg_reg_free(s,TVar1,local_68);
            _Var4 = tcg_out_mov(s,(TCGType_conflict)((ulong)*(undefined8 *)pTVar8 >> 0x18) & 0xff,
                                TVar1,(TCGReg)*(undefined8 *)pTVar8 & 0xff);
            if (!_Var4) {
              temp_sync(s,pTVar8,local_68,0,0);
              tcg_out_ld(s,(TCGType_conflict)((ulong)*(undefined8 *)pTVar8 >> 0x18) & 0xff,TVar1,
                         (TCGReg)*(undefined8 *)pTVar8->mem_base & 0xff,pTVar8->mem_offset);
            }
          }
        }
        else {
          tcg_reg_free(s,TVar1,local_68);
          temp_load(s,pTVar8,1 << ((byte)TVar1 & 0x1f),local_68,0);
        }
        local_68 = 1 << ((byte)TVar1 & 0x1f) | local_68;
      }
    }
    while (local_30 = TVar1, (int)local_30 < (int)(TVar7 + uVar6)) {
      if (((uint)uVar5 & 4 << ((byte)local_30 & 0x1f)) != 0) {
        pTVar8 = arg_temp(op->args[(int)local_30]);
        temp_dead(s,pTVar8);
      }
      TVar1 = local_30 + 1;
    }
    for (local_30 = TCG_REG_EAX; (int)local_30 < 0x20; local_30 = local_30 + TCG_REG_ECX) {
      if ((s->tcg_target_call_clobber_regs >> ((byte)local_30 & 0x1f) & 1) != 0) {
        tcg_reg_free(s,local_30,local_68);
      }
    }
    if ((uVar3 & 1) == 0) {
      if ((uVar3 & 2) == 0) {
        save_globals(s,local_68);
      }
      else {
        sync_globals(s,local_68);
      }
    }
    tcg_out_call(s,dest);
    for (local_30 = 0; (int)local_30 < (int)uVar6; local_30 = local_30 + 1) {
      pTVar8 = arg_temp(op->args[(int)local_30]);
      uVar2 = tcg_target_call_oarg_regs[(int)local_30];
      if (((uint)((ulong)*(undefined8 *)pTVar8 >> 8) & 0xff) == 1) {
        s->reg_to_temp[(uint)*(undefined8 *)pTVar8 & 0xff] = (TCGTemp *)0x0;
      }
      *(ulong *)pTVar8 = *(ulong *)pTVar8 & 0xffffffffffff00ff | 0x100;
      *(ulong *)pTVar8 = *(ulong *)pTVar8 & 0xffffffffffffff00 | (ulong)uVar2 & 0xff;
      *(ulong *)pTVar8 = *(ulong *)pTVar8 & 0xfffffff7ffffffff;
      s->reg_to_temp[uVar2] = pTVar8;
      bVar9 = (byte)local_30;
      if (((uint)uVar5 & 1 << (bVar9 & 0x1f)) == 0) {
        if (((uint)uVar5 & 4 << (bVar9 & 0x1f)) != 0) {
          temp_dead(s,pTVar8);
        }
      }
      else {
        temp_sync(s,pTVar8,local_68,0,(uint)uVar5 & 4 << (bVar9 & 0x1f));
      }
    }
    return;
  }
  fprintf(_stderr,"%s:%d: tcg fatal error\n",
          "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
          ,0xe1e);
  abort();
}

Assistant:

static void tcg_reg_alloc_call(TCGContext *s, TCGOp *op)
{
    const int nb_oargs = TCGOP_CALLO(op);
    const int nb_iargs = TCGOP_CALLI(op);
    const TCGLifeData arg_life = op->life;
    int flags, nb_regs, i;
    TCGReg reg;
    TCGArg arg;
    TCGTemp *ts;
    intptr_t stack_offset;
    size_t call_stack_size;
    tcg_insn_unit *func_addr;
    int allocate_args;
    TCGRegSet allocated_regs;

    func_addr = (tcg_insn_unit *)(intptr_t)op->args[nb_oargs + nb_iargs];
    flags = op->args[nb_oargs + nb_iargs + 1];

    nb_regs = ARRAY_SIZE(tcg_target_call_iarg_regs);
#if TCG_TARGET_REG_BITS != 64
#ifdef _MSC_VER
    // do this because MSVC cannot have array with 0 entries.
    /* ref: tcg/i386/tcg-target.inc.c: tcg_target_call_iarg_regs,
       it is added a dummy value, set back to 0. */
    nb_regs = 0;
#endif
#endif
    if (nb_regs > nb_iargs) {
        nb_regs = nb_iargs;
    }

    /* assign stack slots first */
    call_stack_size = (nb_iargs - nb_regs) * sizeof(tcg_target_long);
    call_stack_size = (call_stack_size + TCG_TARGET_STACK_ALIGN - 1) & 
        ~(TCG_TARGET_STACK_ALIGN - 1);
    allocate_args = (call_stack_size > TCG_STATIC_CALL_ARGS_SIZE);
    if (allocate_args) {
        /* XXX: if more than TCG_STATIC_CALL_ARGS_SIZE is needed,
           preallocate call stack */
        tcg_abort();
    }

    stack_offset = TCG_TARGET_CALL_STACK_OFFSET;
    for (i = nb_regs; i < nb_iargs; i++) {
        arg = op->args[nb_oargs + i];
#ifdef TCG_TARGET_STACK_GROWSUP
        stack_offset -= sizeof(tcg_target_long);
#endif
        if (arg != TCG_CALL_DUMMY_ARG) {
            ts = arg_temp(arg);
            temp_load(s, ts, s->tcg_target_available_regs[ts->type],
                      s->reserved_regs, 0);
            tcg_out_st(s, ts->type, ts->reg, TCG_REG_CALL_STACK, stack_offset);
        }
#ifndef TCG_TARGET_STACK_GROWSUP
        stack_offset += sizeof(tcg_target_long);
#endif
    }
    
    /* assign input registers */
    allocated_regs = s->reserved_regs;
    for (i = 0; i < nb_regs; i++) {
        arg = op->args[nb_oargs + i];
        if (arg != TCG_CALL_DUMMY_ARG) {
            ts = arg_temp(arg);
            reg = tcg_target_call_iarg_regs[i];

            if (ts->val_type == TEMP_VAL_REG) {
                if (ts->reg != reg) {
                    tcg_reg_free(s, reg, allocated_regs);
                    if (!tcg_out_mov(s, ts->type, reg, ts->reg)) {
                        /*
                         * Cross register class move not supported.  Sync the
                         * temp back to its slot and load from there.
                         */
                        temp_sync(s, ts, allocated_regs, 0, 0);
                        tcg_out_ld(s, ts->type, reg,
                                   ts->mem_base->reg, ts->mem_offset);
                    }
                }
            } else {
                TCGRegSet arg_set = 0;

                tcg_reg_free(s, reg, allocated_regs);
                tcg_regset_set_reg(arg_set, reg);
                temp_load(s, ts, arg_set, allocated_regs, 0);
            }

            tcg_regset_set_reg(allocated_regs, reg);
        }
    }
    
    /* mark dead temporaries and free the associated registers */
    for (i = nb_oargs; i < nb_iargs + nb_oargs; i++) {
        if (IS_DEAD_ARG(i)) {
            temp_dead(s, arg_temp(op->args[i]));
        }
    }
    
    /* clobber call registers */
    for (i = 0; i < TCG_TARGET_NB_REGS; i++) {
        if (tcg_regset_test_reg(s->tcg_target_call_clobber_regs, i)) {
            tcg_reg_free(s, i, allocated_regs);
        }
    }

    /* Save globals if they might be written by the helper, sync them if
       they might be read. */
    if (flags & TCG_CALL_NO_READ_GLOBALS) {
        /* Nothing to do */
    } else if (flags & TCG_CALL_NO_WRITE_GLOBALS) {
        sync_globals(s, allocated_regs);
    } else {
        save_globals(s, allocated_regs);
    }

    tcg_out_call(s, func_addr);

    /* assign output registers and emit moves if needed */
    for(i = 0; i < nb_oargs; i++) {
        arg = op->args[i];
        ts = arg_temp(arg);

        /* ENV should not be modified.  */
        tcg_debug_assert(!ts->fixed_reg);

        reg = tcg_target_call_oarg_regs[i];
        tcg_debug_assert(s->reg_to_temp[reg] == NULL);
        if (ts->val_type == TEMP_VAL_REG) {
            s->reg_to_temp[ts->reg] = NULL;
        }
        ts->val_type = TEMP_VAL_REG;
        ts->reg = reg;
        ts->mem_coherent = 0;
        s->reg_to_temp[reg] = ts;
        if (NEED_SYNC_ARG(i)) {
            temp_sync(s, ts, allocated_regs, 0, IS_DEAD_ARG(i));
        } else if (IS_DEAD_ARG(i)) {
            temp_dead(s, ts);
        }
    }
}